

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall diligent_spirv_cross::Compiler::is_tessellating_triangles(Compiler *this)

{
  __node_base_ptr p_Var1;
  ulong __code;
  
  __code = (ulong)(this->ir).default_entry_point.id;
  p_Var1 = ::std::
           _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->ir).entry_points._M_h,
                      __code % (this->ir).entry_points._M_h._M_bucket_count,
                      &(this->ir).default_entry_point,__code);
  return (bool)((*(byte *)((long)&p_Var1->_M_nxt[0x12]._M_nxt + 2) & 0x40) >> 6);
}

Assistant:

bool Compiler::is_tessellating_triangles() const
{
	return get_execution_mode_bitset().get(ExecutionModeTriangles);
}